

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_api.cc
# Opt level: O1

int XLearnHello(void)

{
  ostream *poVar1;
  Modifier reset;
  Modifier bold;
  Modifier def;
  Modifier green;
  string logo;
  Modifier local_48;
  Modifier local_44;
  Modifier local_40;
  Modifier local_3c;
  char *local_38;
  long local_30;
  char local_28 [16];
  
  local_38 = local_28;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_38,
             "----------------------------------------------------------------------------------------------\n           _\n          | |\n     __  _| |     ___  __ _ _ __ _ __\n     \\ \\/ / |    / _ \\/ _` | \'__| \'_ \\ \n      >  <| |___|  __/ (_| | |  | | | |\n     /_/\\_\\_____/\\___|\\__,_|_|  |_| |_|\n\n        xLearn   -- 0.44 Version --\n----------------------------------------------------------------------------------------------\n\n"
             ,"");
  local_3c.code = FG_GREEN;
  local_40.code = FG_DEFAULT;
  local_44.code = BOLD;
  local_48.code = RESET;
  poVar1 = Color::operator<<((ostream *)&std::cout,&local_3c);
  poVar1 = Color::operator<<(poVar1,&local_44);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>(poVar1,local_38,local_30);
  poVar1 = Color::operator<<(poVar1,&local_40);
  Color::operator<<(poVar1,&local_48);
  if (local_38 != local_28) {
    operator_delete(local_38);
  }
  return 0;
}

Assistant:

XL_DLL int XLearnHello() {
  API_BEGIN();
  std::string logo = 
"----------------------------------------------------------------------------------------------\n"
                    "           _\n"
                    "          | |\n"
                    "     __  _| |     ___  __ _ _ __ _ __\n"
                    "     \\ \\/ / |    / _ \\/ _` | '__| '_ \\ \n"
                    "      >  <| |___|  __/ (_| | |  | | | |\n"
                    "     /_/\\_\\_____/\\___|\\__,_|_|  |_| |_|\n\n"
                    "        xLearn   -- 0.44 Version --\n"
"----------------------------------------------------------------------------------------------\n"
"\n";
  Color::Modifier green(Color::FG_GREEN);
  Color::Modifier def(Color::FG_DEFAULT);
  Color::Modifier bold(Color::BOLD);
  Color::Modifier reset(Color::RESET);
  std::cout << green << bold << logo << def << reset;
  API_END();
}